

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::leU(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  
  uVar1 = (this->type).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  iVar3 = (int)uVar1;
  if (iVar3 == 3) {
    uVar1 = (this->field_0).func.super_IString.str._M_len;
    uVar2 = (other->field_0).func.super_IString.str._M_len;
    bVar4 = uVar1 < uVar2;
    bVar5 = uVar1 == uVar2;
  }
  else {
    if (iVar3 != 2) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x574);
    }
    bVar4 = (uint)(this->field_0).i32 < (uint)(other->field_0).i32;
    bVar5 = (this->field_0).i32 == (other->field_0).i32;
  }
  *(uint *)&__return_storage_ptr__->field_0 = (uint)(bVar4 || bVar5);
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::leU(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(uint32_t(i32) <= uint32_t(other.i32));
    case Type::i64:
      return Literal(uint64_t(i64) <= uint64_t(other.i64));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}